

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_lid_tlv(oonf_layer2_neigh_key *key,dlep_session *session,dlep_parser_value *value)

{
  uint8_t *ptr;
  dlep_parser_value *value_local;
  dlep_session *session_local;
  oonf_layer2_neigh_key *key_local;
  
  ptr = (uint8_t *)value;
  if ((value == (dlep_parser_value *)0x0) &&
     (ptr = (uint8_t *)dlep_session_get_tlv_value(session,0x15),
     (dlep_parser_value *)ptr == (dlep_parser_value *)0x0)) {
    key_local._4_4_ = -1;
  }
  else {
    memcpy(key->link_id,(session->parser).tlv_ptr + *(ushort *)(ptr + 4),(ulong)*(ushort *)(ptr + 6)
          );
    key->link_id_length = (uint8_t)*(undefined2 *)(ptr + 6);
    key_local._4_4_ = 0;
  }
  return key_local._4_4_;
}

Assistant:

int
dlep_reader_lid_tlv(struct oonf_layer2_neigh_key *key, struct dlep_session *session, struct dlep_parser_value *value) {
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_LID_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  memcpy(key->link_id, ptr, value->length);
  key->link_id_length = value->length;
  return 0;
}